

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O0

void Curl_cookie_cleanup(CookieInfo *c)

{
  uint local_14;
  uint i;
  CookieInfo *c_local;
  
  if (c != (CookieInfo *)0x0) {
    (*Curl_cfree)(c->filename);
    for (local_14 = 0; local_14 < 0x100; local_14 = local_14 + 1) {
      Curl_cookie_freelist(c->cookies[local_14]);
    }
    (*Curl_cfree)(c);
  }
  return;
}

Assistant:

void Curl_cookie_cleanup(struct CookieInfo *c)
{
  if(c) {
    unsigned int i;
    free(c->filename);
    for(i = 0; i < COOKIE_HASH_SIZE; i++)
      Curl_cookie_freelist(c->cookies[i]);
    free(c); /* free the base struct as well */
  }
}